

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# view.cpp
# Opt level: O2

void polyscope::view::processRotate(vec2 startP,vec2 endP)

{
  double dVar1;
  undefined1 auVar2 [16];
  int i;
  long lVar3;
  uint *v;
  vec3 *lookDir;
  int j;
  int iVar4;
  anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3 *paVar5;
  anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3 *paVar6;
  mat<4,_4,_float,_(glm::qualifier)0> *__return_storage_ptr__;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  anon_union_4_3_4e90da17_for_vec<2,_float,_(glm::qualifier)0>_3 aVar9;
  anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5 aVar25;
  undefined1 auVar11 [16];
  double dVar10;
  undefined1 auVar12 [16];
  anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3 aVar22;
  undefined1 in_register_00001208 [56];
  undefined1 auVar24 [56];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  anon_union_4_3_4e90da17_for_vec<2,_float,_(glm::qualifier)0>_3 aVar26;
  undefined1 auVar27 [16];
  undefined1 in_register_00001248 [56];
  undefined1 auVar30 [60];
  undefined1 auVar29 [64];
  vec<3,_float,_(glm::qualifier)0> vVar31;
  vec3 vVar32;
  col_type cVar33;
  mat4x4 thetaCamR;
  vec3 frameRightDir;
  vec3 frameUpDir;
  mat4 update;
  mat4x4 phiCamR;
  vec3 frameLookDir;
  undefined1 local_1e8 [16];
  undefined1 local_1d8 [16];
  anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3 local_1c8 [2];
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 aStack_1c0;
  undefined4 uStack_1bc;
  undefined4 uStack_1b8;
  undefined4 uStack_1b4;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined4 uStack_1a0;
  undefined4 uStack_19c;
  undefined4 uStack_198;
  undefined4 uStack_194;
  undefined4 uStack_190;
  undefined4 uStack_18c;
  undefined1 local_188 [16];
  undefined1 local_178 [16];
  undefined1 local_168 [12];
  undefined1 local_15c [12];
  anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9 local_150;
  anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9 aStack_14c;
  anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3 aStack_148;
  anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5 aStack_144;
  anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9 aStack_140;
  anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9 aStack_13c;
  col_type cStack_138;
  anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5 aStack_128;
  anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7 aStack_124;
  anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9 aStack_120;
  undefined4 uStack_11c;
  undefined4 uStack_118;
  undefined4 uStack_114;
  undefined1 local_110 [32];
  col_type cStack_f0;
  col_type cStack_e0;
  mat<4,_4,_float,_(glm::qualifier)0> local_d0;
  vec<3,_float,_(glm::qualifier)0> local_90;
  vec<3,_float,_(glm::qualifier)0> local_80;
  vec3 local_74;
  mat<4,_4,_float,_(glm::qualifier)0> local_68;
  undefined1 auVar13 [64];
  undefined1 extraout_var [60];
  undefined8 uVar23;
  undefined1 auVar28 [64];
  
  auVar28._8_56_ = in_register_00001248;
  auVar28._0_8_ = endP;
  auVar13._8_56_ = in_register_00001208;
  auVar13._0_8_ = startP;
  aVar9 = startP.field_0;
  aVar26 = endP.field_0;
  local_178 = vmovshdup_avx(auVar13._0_16_);
  local_188 = vmovshdup_avx(auVar28._0_16_);
  if ((aVar9.x == aVar26.x) && (!NAN(aVar9.x) && !NAN(aVar26.x))) {
    if ((local_178._0_4_ == local_188._0_4_) && (!NAN(local_178._0_4_) && !NAN(local_188._0_4_))) {
      return;
    }
  }
  lookDir = &local_74;
  getCameraFrame(lookDir,(vec3 *)local_15c,(vec3 *)local_168);
  auVar30 = auVar28._4_60_;
  v = &switchD_001cf75b::switchdataD_002c2200;
  local_1d8._8_8_ = in_register_00001248._0_8_;
  local_1e8._8_8_ = in_register_00001208._0_8_;
  switch(style) {
  case 0:
    dVar10 = ((double)(aVar26.x - aVar9.x) + (double)(aVar26.x - aVar9.x)) * moveScale;
    dVar1 = ((double)((float)local_188._0_4_ - (float)local_178._0_4_) +
            (double)((float)local_188._0_4_ - (float)local_178._0_4_)) * moveScale;
    local_1e8._4_4_ = (int)((ulong)dVar1 >> 0x20);
    local_1e8._0_4_ = (float)dVar1;
    auVar24 = ZEXT856(0);
    local_1e8._8_8_ = 0;
    vVar32 = state::center();
    aStack_1c0 = vVar32.field_2;
    auVar14._0_8_ = vVar32._0_8_;
    auVar14._8_56_ = auVar24;
    uVar23 = vmovlps_avx(auVar14._0_16_);
    local_1c8[0] = SUB84(uVar23,0);
    local_1c8[1] = SUB84((ulong)uVar23 >> 0x20,0);
    glm::translate<float,(glm::qualifier)0>
              ((mat<4,_4,_float,_(glm::qualifier)0> *)local_110,(glm *)&viewMat,
               (mat<4,_4,_float,_(glm::qualifier)0> *)local_1c8,
               (vec<3,_float,_(glm::qualifier)0> *)v);
    local_1c8[0].x = 1.0;
    viewMat = local_110._0_4_;
    viewMat_4 = (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)local_110._4_4_;
    DAT_0059f6dc = (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)local_110._8_4_;
    _DAT_0059f6e0 = (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)local_110._12_4_
    ;
    uRam000000000059f6e4._0_4_ =
         (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)local_110._16_4_;
    DAT_0059f6e8 = local_110._20_4_;
    DAT_0059f6ec = (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)local_110._24_4_;
    DAT_0059f6f0 = (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)local_110._28_4_;
    uRam000000000059f6f4._0_4_ = cStack_f0.field_0;
    uRam000000000059f6f4._4_4_ = cStack_f0.field_1.y;
    DAT_0059f6fc = cStack_f0.field_2;
    _DAT_0059f700 = cStack_f0.field_3;
    uRam000000000059f704._0_4_ = cStack_e0.field_0;
    uRam000000000059f704._4_4_ = cStack_e0.field_1;
    uRam000000000059f70c._0_4_ = cStack_e0.field_2;
    DAT_0059f710 = cStack_e0.field_3;
    local_1c8[1].x = 0.0;
    aStack_1c0 = (anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7)0x0;
    uStack_1bc = 0;
    uStack_1b8 = 0;
    uStack_1b4 = 0x3f800000;
    uStack_1b0 = 0;
    uStack_1a8 = 0;
    uStack_1a0 = 0x3f800000;
    uStack_19c = 0;
    uStack_198 = 0;
    uStack_194 = 0;
    uStack_190 = 0;
    uStack_18c = 0x3f800000;
    auVar2._8_4_ = 0x80000000;
    auVar2._0_8_ = 0x8000000080000000;
    auVar2._12_4_ = 0x80000000;
    auVar8 = vxorps_avx512vl(local_1e8,auVar2);
    glm::rotate<float,(glm::qualifier)0>
              ((mat<4,_4,_float,_(glm::qualifier)0> *)local_110,(glm *)local_1c8,
               (mat<4,_4,_float,_(glm::qualifier)0> *)local_168,auVar8._0_4_,
               (vec<3,_float,_(glm::qualifier)0> *)v);
    glm::operator*((mat<4,_4,_float,_(glm::qualifier)0> *)local_1c8,
                   (mat<4,_4,_float,_(glm::qualifier)0> *)&viewMat,
                   (mat<4,_4,_float,_(glm::qualifier)0> *)local_110);
    _viewMat = CONCAT44(local_1c8[1],local_1c8[0]);
    _DAT_0059f6dc = CONCAT44(uStack_1bc,aStack_1c0);
    uRam000000000059f6e4 = CONCAT44(uStack_1b4,uStack_1b8);
    _DAT_0059f6fc = CONCAT44(uStack_19c,uStack_1a0);
    uRam000000000059f704 = CONCAT44(uStack_194,uStack_198);
    uRam000000000059f70c = CONCAT44(uStack_18c,uStack_190);
    local_150.w = 1.0;
    _DAT_0059f6ec = uStack_1b0;
    uRam000000000059f6f4 = uStack_1a8;
    aStack_14c.w = 0.0;
    aStack_148.x = 0.0;
    aStack_144.y = 0.0;
    aStack_140.w = 0.0;
    aStack_13c.w = 1.0;
    cStack_138.field_0 = (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)0x0;
    cStack_138.field_1 = (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)0x0;
    cStack_138.field_2 = (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)0x0;
    cStack_138.field_3 = (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)0x0;
    aStack_128.y = 1.0;
    aStack_124.z = 0.0;
    aStack_120.w = 0.0;
    uStack_11c = 0;
    uStack_118 = 0;
    uStack_114 = 0x3f800000;
    auVar24 = ZEXT856(0);
    vVar32 = getUpVec();
    local_d0.value[0].field_2 =
         (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)vVar32.field_2;
    auVar15._0_8_ = vVar32._0_8_;
    auVar15._8_56_ = auVar24;
    local_d0.value[0]._0_8_ = vmovlps_avx(auVar15._0_16_);
    glm::rotate<float,(glm::qualifier)0>
              ((mat<4,_4,_float,_(glm::qualifier)0> *)local_1c8,(glm *)(local_15c + 0xc),&local_d0,
               (float)dVar10,(vec<3,_float,_(glm::qualifier)0> *)v);
    glm::operator*((mat<4,_4,_float,_(glm::qualifier)0> *)(local_15c + 0xc),
                   (mat<4,_4,_float,_(glm::qualifier)0> *)&viewMat,
                   (mat<4,_4,_float,_(glm::qualifier)0> *)local_1c8);
    _viewMat = CONCAT44(aStack_14c,local_150);
    DAT_0059f6dc.x = aStack_148.x;
    _DAT_0059f6e0 = aStack_144.y;
    uRam000000000059f6e4 = CONCAT44(aStack_13c,aStack_140);
    _DAT_0059f6fc = CONCAT44(aStack_124,aStack_128);
    uRam000000000059f704 = CONCAT44(uStack_11c,aStack_120);
    uRam000000000059f70c = CONCAT44(uStack_114,uStack_118);
    DAT_0059f6ec = cStack_138.field_0;
    DAT_0059f6f0 = cStack_138.field_1;
    uRam000000000059f6f4._0_4_ = cStack_138.field_2.z;
    uRam000000000059f6f4._4_4_ = cStack_138.field_3;
    aVar22 = aStack_148;
    aVar25 = aStack_144;
    vVar32 = state::center();
    local_d0.value[0].field_2 =
         (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)vVar32.field_2;
    auVar11._0_8_ = vVar32._0_8_ ^ 0x8000000080000000;
    auVar11._8_4_ = -aVar22.x;
    auVar11._12_4_ = -aVar25.y;
    local_d0.value[0]._0_8_ = vmovlps_avx(auVar11);
    break;
  case 1:
    dVar10 = ((double)(aVar26.x - aVar9.x) + (double)(aVar26.x - aVar9.x)) * moveScale;
    dVar1 = ((double)((float)local_188._0_4_ - (float)local_178._0_4_) +
            (double)((float)local_188._0_4_ - (float)local_178._0_4_)) * moveScale;
    auVar24 = ZEXT856(0);
    vVar32 = state::center();
    aStack_1c0 = vVar32.field_2;
    auVar19._0_8_ = vVar32._0_8_;
    auVar19._8_56_ = auVar24;
    uVar23 = vmovlps_avx(auVar19._0_16_);
    local_1c8[0] = SUB84(uVar23,0);
    local_1c8[1] = SUB84((ulong)uVar23 >> 0x20,0);
    glm::translate<float,(glm::qualifier)0>
              ((mat<4,_4,_float,_(glm::qualifier)0> *)local_110,(glm *)&viewMat,
               (mat<4,_4,_float,_(glm::qualifier)0> *)local_1c8,
               (vec<3,_float,_(glm::qualifier)0> *)v);
    local_1c8[0].x = 1.0;
    viewMat = local_110._0_4_;
    viewMat_4 = (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)local_110._4_4_;
    DAT_0059f6dc = (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)local_110._8_4_;
    _DAT_0059f6e0 = (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)local_110._12_4_
    ;
    uRam000000000059f6e4._0_4_ =
         (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)local_110._16_4_;
    DAT_0059f6e8 = local_110._20_4_;
    DAT_0059f6ec = (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)local_110._24_4_;
    DAT_0059f6f0 = (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)local_110._28_4_;
    uRam000000000059f6f4._0_4_ = cStack_f0.field_0;
    uRam000000000059f6f4._4_4_ = cStack_f0.field_1.y;
    DAT_0059f6fc = cStack_f0.field_2;
    _DAT_0059f700 = cStack_f0.field_3;
    uRam000000000059f704._0_4_ = cStack_e0.field_0;
    uRam000000000059f704._4_4_ = cStack_e0.field_1;
    uRam000000000059f70c._0_4_ = cStack_e0.field_2;
    DAT_0059f710 = cStack_e0.field_3;
    local_1c8[1].x = 0.0;
    aStack_1c0 = (anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7)0x0;
    uStack_1bc = 0;
    uStack_1b8 = 0;
    uStack_1b4 = 0x3f800000;
    uStack_1b0 = 0;
    uStack_1a8 = 0;
    uStack_1a0 = 0x3f800000;
    uStack_19c = 0;
    uStack_198 = 0;
    uStack_194 = 0;
    uStack_190 = 0;
    uStack_18c = 0x3f800000;
    glm::rotate<float,(glm::qualifier)0>
              ((mat<4,_4,_float,_(glm::qualifier)0> *)local_110,(glm *)local_1c8,
               (mat<4,_4,_float,_(glm::qualifier)0> *)local_15c,(float)dVar10,
               (vec<3,_float,_(glm::qualifier)0> *)v);
    glm::operator*((mat<4,_4,_float,_(glm::qualifier)0> *)local_1c8,
                   (mat<4,_4,_float,_(glm::qualifier)0> *)&viewMat,
                   (mat<4,_4,_float,_(glm::qualifier)0> *)local_110);
    _viewMat = CONCAT44(local_1c8[1],local_1c8[0]);
    _DAT_0059f6dc = CONCAT44(uStack_1bc,aStack_1c0);
    uRam000000000059f6e4 = CONCAT44(uStack_1b4,uStack_1b8);
    _DAT_0059f6fc = CONCAT44(uStack_19c,uStack_1a0);
    uRam000000000059f704 = CONCAT44(uStack_194,uStack_198);
    uRam000000000059f70c = CONCAT44(uStack_18c,uStack_190);
    local_150.w = 1.0;
    _DAT_0059f6ec = uStack_1b0;
    uRam000000000059f6f4 = uStack_1a8;
    aStack_14c.w = 0.0;
    aStack_148.x = 0.0;
    aStack_144.y = 0.0;
    aStack_140.w = 0.0;
    aStack_13c.w = 1.0;
    cStack_138.field_0 = (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)0x0;
    cStack_138.field_1 = (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)0x0;
    cStack_138.field_2 = (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)0x0;
    cStack_138.field_3 = (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)0x0;
    aStack_128.y = 1.0;
    aStack_124.z = 0.0;
    aStack_120.w = 0.0;
    uStack_11c = 0;
    uStack_118 = 0;
    uStack_114 = 0x3f800000;
    glm::rotate<float,(glm::qualifier)0>
              ((mat<4,_4,_float,_(glm::qualifier)0> *)local_1c8,(glm *)(local_15c + 0xc),
               (mat<4,_4,_float,_(glm::qualifier)0> *)local_168,-(float)dVar1,
               (vec<3,_float,_(glm::qualifier)0> *)v);
    glm::operator*((mat<4,_4,_float,_(glm::qualifier)0> *)(local_15c + 0xc),
                   (mat<4,_4,_float,_(glm::qualifier)0> *)&viewMat,
                   (mat<4,_4,_float,_(glm::qualifier)0> *)local_1c8);
    _viewMat = CONCAT44(aStack_14c,local_150);
    uRam000000000059f6e4 = CONCAT44(aStack_13c,aStack_140);
    _DAT_0059f6fc = CONCAT44(aStack_124,aStack_128);
    uRam000000000059f704 = CONCAT44(uStack_11c,aStack_120);
    uRam000000000059f70c = CONCAT44(uStack_114,uStack_118);
    DAT_0059f6dc.x = aStack_148.x;
    _DAT_0059f6e0 = aStack_144.y;
    DAT_0059f6ec = cStack_138.field_0;
    DAT_0059f6f0 = cStack_138.field_1;
    uRam000000000059f6f4._0_4_ = cStack_138.field_2.z;
    uRam000000000059f6f4._4_4_ = cStack_138.field_3;
    aVar22 = aStack_148;
    aVar25 = aStack_144;
    vVar32 = state::center();
    local_d0.value[0].field_2 =
         (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)vVar32.field_2;
    auVar12._0_8_ = vVar32._0_8_ ^ 0x8000000080000000;
    auVar12._8_4_ = (uint)aVar22 ^ 0x80000000;
    auVar12._12_4_ = (uint)aVar25 ^ 0x80000000;
    local_d0.value[0]._0_8_ = vmovlps_avx(auVar12);
    break;
  default:
    goto switchD_001cf75b_caseD_2;
  case 3:
    auVar24 = ZEXT856((ulong)local_1e8._8_8_);
    vVar32 = processRotate::anon_class_1_0_00000001::operator()
                       ((anon_class_1_0_00000001 *)lookDir,startP);
    local_80.field_2 = vVar32.field_2;
    auVar16._0_8_ = vVar32._0_8_;
    auVar16._8_56_ = auVar24;
    local_80._0_8_ = vmovlps_avx(auVar16._0_16_);
    auVar24 = ZEXT856((ulong)local_1d8._8_8_);
    vVar32 = processRotate::anon_class_1_0_00000001::operator()
                       ((anon_class_1_0_00000001 *)lookDir,endP);
    uVar23 = auVar24._0_8_;
    local_90.field_2 = vVar32.field_2;
    auVar17._0_8_ = vVar32._0_8_;
    auVar17._8_56_ = auVar24;
    local_90._0_8_ = vmovlps_avx(auVar17._0_16_);
    vVar31 = glm::detail::compute_cross<float,_(glm::qualifier)0,_false>::call(&local_80,&local_90);
    auVar29._0_4_ = vVar31.field_2;
    auVar29._4_60_ = auVar30;
    auVar7._8_4_ = 0x80000000;
    auVar7._0_8_ = 0x8000000080000000;
    auVar7._12_4_ = 0x80000000;
    auVar7 = vxorps_avx512vl(auVar29._0_16_,auVar7);
    auVar18._0_4_ =
         glm::detail::compute_dot<glm::vec<3,_float,_(glm::qualifier)0>,_float,_false>::call
                   (&local_80,&local_90);
    auVar18._4_60_ = extraout_var;
    auVar8 = vmaxss_avx(SUB6416(ZEXT464(0xbf800000),0),auVar18._0_16_);
    auVar8 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar8);
    dVar10 = acos((double)auVar8._0_4_ * moveScale);
    local_1c8[0].x = 1.0;
    local_1c8[1].x = 0.0;
    aStack_1c0 = (anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7)0x0;
    uStack_1bc = 0;
    uStack_1b8 = 0;
    uStack_1b4 = 0x3f800000;
    uStack_1b0 = 0;
    uStack_1a8 = 0;
    uStack_1a0 = 0x3f800000;
    uStack_19c = 0;
    uStack_198 = 0;
    uStack_194 = 0;
    uStack_190 = 0;
    uStack_18c = 0x3f800000;
    auVar27._0_8_ = vVar31._0_8_ ^ 0x8000000080000000;
    auVar27._8_4_ = (uint)uVar23 ^ 0x80000000;
    auVar27._12_4_ = (uint)((ulong)uVar23 >> 0x20) ^ 0x80000000;
    uVar23 = vmovlps_avx(auVar27);
    local_150 = SUB84(uVar23,0);
    aStack_14c = SUB84((ulong)uVar23 >> 0x20,0);
    local_1e8._0_4_ = auVar7._0_4_;
    aStack_148 = (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)local_1e8._0_4_;
    glm::rotate<float,(glm::qualifier)0>
              ((mat<4,_4,_float,_(glm::qualifier)0> *)local_110,(glm *)local_1c8,
               (mat<4,_4,_float,_(glm::qualifier)0> *)(local_15c + 0xc),(float)dVar10,
               (vec<3,_float,_(glm::qualifier)0> *)v);
    for (lVar3 = 0; lVar3 != 3; lVar3 = lVar3 + 1) {
      for (iVar4 = 0;
          ((paVar5 = (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3 *)
                     ((long)&viewMat_4 + lVar3 * 0x10), paVar6 = local_1c8 + lVar3 * 4 + 1,
           iVar4 == 1 ||
           (paVar5 = &DAT_0059f6dc + lVar3 * 4, paVar6 = local_1c8 + lVar3 * 4 + 2, iVar4 == 2)) ||
          (paVar5 = (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3 *)
                    (&viewMat + lVar3 * 4), paVar6 = local_1c8 + lVar3 * 4, iVar4 != 3));
          iVar4 = iVar4 + 1) {
        *paVar6 = *paVar5;
      }
    }
    uStack_18c = 0x3f800000;
    glm::detail::compute_inverse<4,_4,_float,_(glm::qualifier)0,_false>::call
              (&local_68,(mat<4,_4,_float,_(glm::qualifier)0> *)local_1c8);
    glm::operator*(&local_d0,&local_68,(mat<4,_4,_float,_(glm::qualifier)0> *)local_110);
    glm::operator*((mat<4,_4,_float,_(glm::qualifier)0> *)(local_15c + 0xc),&local_d0,
                   (mat<4,_4,_float,_(glm::qualifier)0> *)local_1c8);
    __return_storage_ptr__ = &local_d0;
    glm::operator*(__return_storage_ptr__,(mat<4,_4,_float,_(glm::qualifier)0> *)&viewMat,
                   (mat<4,_4,_float,_(glm::qualifier)0> *)(local_15c + 0xc));
    goto LAB_001cfc8b;
  case 5:
    dVar10 = ((double)(aVar26.x - aVar9.x) + (double)(aVar26.x - aVar9.x)) * moveScale;
    dVar1 = ((double)((float)local_188._0_4_ - (float)local_178._0_4_) +
            (double)((float)local_188._0_4_ - (float)local_178._0_4_)) * moveScale;
    local_1d8._4_4_ = (int)((ulong)dVar1 >> 0x20);
    local_1d8._0_4_ = (float)dVar1;
    auVar24 = ZEXT856(0);
    local_1d8._8_8_ = 0;
    glm::mat<3,_3,_float,_(glm::qualifier)0>::mat
              ((mat<3,_3,_float,_(glm::qualifier)0> *)local_110,
               (mat<4,_4,_float,_(glm::qualifier)0> *)&viewMat);
    vVar32 = getUpVec();
    aStack_1c0 = vVar32.field_2;
    auVar20._0_8_ = vVar32._0_8_;
    auVar20._8_56_ = auVar24;
    uVar23 = vmovlps_avx(auVar20._0_16_);
    local_1c8[0] = SUB84(uVar23,0);
    local_1c8[1] = SUB84((ulong)uVar23 >> 0x20,0);
    cVar33 = glm::operator*((mat<3,_3,_float,_(glm::qualifier)0> *)local_110,(row_type *)local_1c8);
    local_d0.value[0].field_2 =
         (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)cVar33.field_2;
    auVar21._0_8_ = cVar33._0_8_;
    auVar21._8_56_ = auVar24;
    local_d0.value[0]._0_8_ = vmovlps_avx(auVar21._0_16_);
    local_1c8[0].x = 1.0;
    local_1c8[1].x = 0.0;
    aStack_1c0 = (anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7)0x0;
    uStack_1bc = 0;
    uStack_1b8 = 0;
    uStack_1b4 = 0x3f800000;
    uStack_1b0 = 0;
    uStack_1a8 = 0;
    uStack_1a0 = 0x3f800000;
    uStack_19c = 0;
    uStack_198 = 0;
    uStack_194 = 0;
    uStack_190 = 0;
    uStack_18c = 0x3f800000;
    glm::rotate<float,(glm::qualifier)0>
              ((mat<4,_4,_float,_(glm::qualifier)0> *)local_110,(glm *)local_1c8,&local_d0,
               (float)dVar10,(vec<3,_float,_(glm::qualifier)0> *)v);
    glm::operator*((mat<4,_4,_float,_(glm::qualifier)0> *)local_1c8,
                   (mat<4,_4,_float,_(glm::qualifier)0> *)local_110,
                   (mat<4,_4,_float,_(glm::qualifier)0> *)&viewMat);
    _viewMat = CONCAT44(local_1c8[1],local_1c8[0]);
    _DAT_0059f6dc = CONCAT44(uStack_1bc,aStack_1c0);
    uRam000000000059f6e4 = CONCAT44(uStack_1b4,uStack_1b8);
    _DAT_0059f6fc = CONCAT44(uStack_19c,uStack_1a0);
    uRam000000000059f704 = CONCAT44(uStack_194,uStack_198);
    uRam000000000059f70c = CONCAT44(uStack_18c,uStack_190);
    local_150.w = 1.0;
    _DAT_0059f6ec = uStack_1b0;
    uRam000000000059f6f4 = uStack_1a8;
    local_68.value[0]._0_8_ = vmovlps_avx(SUB6416(ZEXT464(0x3f800000),0));
    local_68.value[0].field_2.z = 0.0;
    aStack_14c.w = 0.0;
    aStack_148.x = 0.0;
    aStack_144.y = 0.0;
    aStack_140.w = 0.0;
    aStack_13c.w = 1.0;
    cStack_138.field_0 = (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)0x0;
    cStack_138.field_1 = (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)0x0;
    cStack_138.field_2 = (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)0x0;
    cStack_138.field_3 = (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)0x0;
    aStack_128.y = 1.0;
    aStack_124.z = 0.0;
    aStack_120.w = 0.0;
    uStack_11c = 0;
    uStack_118 = 0;
    uStack_114 = 0x3f800000;
    auVar8._8_4_ = 0x80000000;
    auVar8._0_8_ = 0x8000000080000000;
    auVar8._12_4_ = 0x80000000;
    auVar8 = vxorps_avx512vl(local_1d8,auVar8);
    glm::rotate<float,(glm::qualifier)0>
              ((mat<4,_4,_float,_(glm::qualifier)0> *)local_1c8,(glm *)(local_15c + 0xc),&local_68,
               auVar8._0_4_,(vec<3,_float,_(glm::qualifier)0> *)v);
    glm::operator*((mat<4,_4,_float,_(glm::qualifier)0> *)(local_15c + 0xc),
                   (mat<4,_4,_float,_(glm::qualifier)0> *)local_1c8,
                   (mat<4,_4,_float,_(glm::qualifier)0> *)&viewMat);
    _viewMat = CONCAT44(aStack_14c,local_150);
    _DAT_0059f6dc = CONCAT44(aStack_144,aStack_148);
    uRam000000000059f6e4 = CONCAT44(aStack_13c,aStack_140);
    _DAT_0059f6fc = CONCAT44(aStack_124,aStack_128);
    uRam000000000059f704 = CONCAT44(uStack_11c,aStack_120);
    uRam000000000059f70c = CONCAT44(uStack_114,uStack_118);
    _DAT_0059f6ec = cStack_138._0_8_;
    uRam000000000059f6f4 = cStack_138._8_8_;
    goto switchD_001cf75b_caseD_2;
  }
  local_d0.value[0].field_2.z = local_d0.value[0].field_2.z ^ 0x80000000;
  __return_storage_ptr__ = (mat<4,_4,_float,_(glm::qualifier)0> *)(local_15c + 0xc);
  glm::translate<float,(glm::qualifier)0>
            (__return_storage_ptr__,(glm *)&viewMat,&local_d0,(vec<3,_float,_(glm::qualifier)0> *)v)
  ;
LAB_001cfc8b:
  viewMat = __return_storage_ptr__->value[0].field_0;
  viewMat_4 = __return_storage_ptr__->value[0].field_1;
  DAT_0059f6dc = *(anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3 *)
                  &__return_storage_ptr__->value[0].field_2;
  _DAT_0059f6e0 = __return_storage_ptr__->value[0].field_3;
  uRam000000000059f6e4._0_4_ = __return_storage_ptr__->value[1].field_0;
  DAT_0059f6e8 = __return_storage_ptr__->value[1].field_1;
  DAT_0059f6ec = *(anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3 *)
                  &__return_storage_ptr__->value[1].field_2;
  DAT_0059f6f0 = *(anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5 *)
                  &__return_storage_ptr__->value[1].field_3;
  uRam000000000059f6f4._0_4_ = __return_storage_ptr__->value[2].field_0;
  uRam000000000059f6f4._4_4_ =
       *(anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9 *)
        &__return_storage_ptr__->value[2].field_1;
  DAT_0059f6fc = __return_storage_ptr__->value[2].field_2;
  _DAT_0059f700 = __return_storage_ptr__->value[2].field_3;
  uRam000000000059f704._0_4_ = __return_storage_ptr__->value[3].field_0;
  uRam000000000059f704._4_4_ = __return_storage_ptr__->value[3].field_1;
  uRam000000000059f70c._0_4_ = __return_storage_ptr__->value[3].field_2;
  DAT_0059f710 = __return_storage_ptr__->value[3].field_3;
switchD_001cf75b_caseD_2:
  requestRedraw();
  midflight = 0;
  return;
}

Assistant:

void processRotate(glm::vec2 startP, glm::vec2 endP) {

  if (startP == endP) {
    return;
  }

  // Get frame
  glm::vec3 frameLookDir, frameUpDir, frameRightDir;
  getCameraFrame(frameLookDir, frameUpDir, frameRightDir);

  switch (getNavigateStyle()) {
  case NavigateStyle::Turntable: {

    glm::vec2 dragDelta = endP - startP;
    float delTheta = 2.0 * dragDelta.x * moveScale;
    float delPhi = 2.0 * dragDelta.y * moveScale;

    // Translate to center
    viewMat = glm::translate(viewMat, state::center());

    // Rotation about the horizontal axis
    glm::mat4x4 phiCamR = glm::rotate(glm::mat4x4(1.0), -delPhi, frameRightDir);
    viewMat = viewMat * phiCamR;

    // Rotation about the vertical axis
    glm::vec3 turntableUp;
    glm::mat4x4 thetaCamR = glm::rotate(glm::mat4x4(1.0), delTheta, getUpVec());
    viewMat = viewMat * thetaCamR;

    // Undo centering
    viewMat = glm::translate(viewMat, -state::center());
    break;
  }
  case NavigateStyle::Free: {
    glm::vec2 dragDelta = endP - startP;
    float delTheta = 2.0 * dragDelta.x * moveScale;
    float delPhi = 2.0 * dragDelta.y * moveScale;

    // Translate to center
    viewMat = glm::translate(viewMat, state::center());

    // Rotation about the vertical axis
    glm::mat4x4 thetaCamR = glm::rotate(glm::mat4x4(1.0), delTheta, frameUpDir);
    viewMat = viewMat * thetaCamR;

    // Rotation about the horizontal axis
    glm::mat4x4 phiCamR = glm::rotate(glm::mat4x4(1.0), -delPhi, frameRightDir);
    viewMat = viewMat * phiCamR;

    // Undo centering
    viewMat = glm::translate(viewMat, -state::center());
    break;
  }
  case NavigateStyle::Planar: {
    // Do nothing
    break;
  }
  case NavigateStyle::Arcball: {
    // Map inputs to unit sphere
    auto toSphere = [](glm::vec2 v) {
      double x = glm::clamp(v.x, -1.0f, 1.0f);
      double y = glm::clamp(v.y, -1.0f, 1.0f);
      double mag = x * x + y * y;
      if (mag <= 1.0) {
        return glm::vec3{x, y, -std::sqrt(1.0 - mag)};
      } else {
        return glm::normalize(glm::vec3{x, y, 0.0});
      }
    };
    glm::vec3 sphereStart = toSphere(startP);
    glm::vec3 sphereEnd = toSphere(endP);

    glm::vec3 rotAxis = -cross(sphereStart, sphereEnd);
    double rotMag = std::acos(glm::clamp(dot(sphereStart, sphereEnd), -1.0f, 1.0f) * moveScale);

    glm::mat4 cameraRotate = glm::rotate(glm::mat4x4(1.0), (float)rotMag, glm::vec3(rotAxis.x, rotAxis.y, rotAxis.z));

    // Get current camera rotation
    glm::mat4x4 R;
    for (int i = 0; i < 3; i++) {
      for (int j = 0; j < 3; j++) {
        R[i][j] = viewMat[i][j];
      }
    }
    R[3][3] = 1.0;

    glm::mat4 update = glm::inverse(R) * cameraRotate * R;

    viewMat = viewMat * update;
    break;
  }
  case NavigateStyle::None: {
    // Do nothing
    break;
  }
  case NavigateStyle::FirstPerson: {
    glm::vec2 dragDelta = endP - startP;
    float delTheta = 2.0 * dragDelta.x * moveScale;
    float delPhi = 2.0 * dragDelta.y * moveScale;

    // Rotation about the vertical axis
    glm::vec3 rotAx = glm::mat3(viewMat) * getUpVec();
    glm::mat4x4 thetaCamR = glm::rotate(glm::mat4x4(1.0), delTheta, rotAx);
    viewMat = thetaCamR * viewMat;

    // Rotation about the horizontal axis
    glm::mat4x4 phiCamR = glm::rotate(glm::mat4x4(1.0), -delPhi, glm::vec3(1.f, 0.f, 0.f));
    viewMat = phiCamR * viewMat;

    break;
  }
  }

  requestRedraw();
  immediatelyEndFlight();
}